

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O2

void __thiscall flatbuffers::FlatBufferBuilder::Clear(FlatBufferBuilder *this)

{
  pointer pFVar1;
  pointer puVar2;
  
  pFVar1 = (this->offsetbuf_).
           super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->buf_).cur_ = (this->buf_).buf_ + (this->buf_).reserved_;
  if ((this->offsetbuf_).
      super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
      ._M_impl.super__Vector_impl_data._M_finish != pFVar1) {
    (this->offsetbuf_).
    super__Vector_base<flatbuffers::FlatBufferBuilder::FieldLoc,_std::allocator<flatbuffers::FlatBufferBuilder::FieldLoc>_>
    ._M_impl.super__Vector_impl_data._M_finish = pFVar1;
  }
  puVar2 = (this->vtables_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->vtables_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->vtables_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  return;
}

Assistant:

void clear() { cur_ = buf_ + reserved_; }